

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void rollback_with_num_keeping_headers(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *pfVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  fdb_doc **doc;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  fdb_kvs_handle *pfVar15;
  ulong uVar16;
  char *pcVar17;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  char bodybuf [1024];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_1e78;
  fdb_file_handle *pfStackY_1e70;
  fdb_kvs_config fStackY_1e68;
  char acStackY_1e50 [264];
  fdb_config fStackY_1d48;
  char acStackY_1c50 [520];
  fdb_doc **ppfStackY_1a48;
  size_t sStackY_1a38;
  char *pcStackY_1a30;
  char *pcStackY_1a28;
  code *pcStackY_1a20;
  fdb_kvs_handle *pfStack_1a10;
  fdb_file_handle *pfStack_1a08;
  fdb_iterator *pfStack_1a00;
  fdb_doc *pfStack_19f8;
  fdb_kvs_handle *pfStack_19f0;
  timeval tStack_19e8;
  char acStack_19d8 [512];
  fdb_kvs_config fStack_17d8;
  fdb_file_info fStack_17c0;
  char acStack_1778 [256];
  fdb_config fStack_1678;
  char *pcStack_1580;
  fdb_kvs_handle *pfStack_1578;
  fdb_kvs_handle *pfStack_1570;
  fdb_kvs_handle *pfStack_1568;
  fdb_kvs_handle *pfStack_1560;
  fdb_kvs_handle *pfStack_1558;
  fdb_kvs_handle *pfStack_1548;
  fdb_file_handle *pfStack_1540;
  uint uStack_1534;
  fdb_kvs_info fStack_1530;
  timeval tStack_1500;
  fdb_kvs_config fStack_14f0;
  undefined1 auStack_14d8 [80];
  docio_handle *pdStack_1488;
  btreeblk_handle *pbStack_1480;
  btree_blk_ops *pbStack_1478;
  filemgr_ops *pfStack_1470;
  fdb_config fStack_1468;
  undefined1 uStack_1291;
  fdb_kvs_handle fStack_1290;
  fdb_kvs_handle *pfStack_1088;
  char *pcStack_1080;
  char *pcStack_1078;
  fdb_kvs_handle *pfStack_1070;
  fdb_kvs_handle *pfStack_1068;
  fdb_file_handle *pfStack_1060;
  timeval tStack_1058;
  undefined1 auStack_1048 [536];
  undefined1 auStack_e30 [375];
  undefined1 uStack_cb9;
  fdb_kvs_handle *pfStack_c30;
  undefined8 uStack_c18;
  fdb_kvs_handle *pfStack_bf0;
  fdb_kvs_handle *pfStack_be8;
  fdb_kvs_handle *pfStack_be0;
  fdb_kvs_handle *pfStack_bd8;
  fdb_kvs_handle *pfStack_bd0;
  code *pcStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  fdb_file_handle *pfStack_bb8;
  fdb_kvs_handle *pfStack_bb0;
  fdb_kvs_handle *pfStack_ba8;
  fdb_kvs_config fStack_ba0;
  timeval tStack_b88;
  fdb_file_info fStack_b78;
  fdb_kvs_info fStack_b30;
  undefined1 auStack_b00 [512];
  fdb_kvs_handle fStack_900;
  size_t sStack_6f8;
  char *pcStack_6f0;
  char *pcStack_6e8;
  code *pcStack_6e0;
  fdb_kvs_handle *local_6d8;
  fdb_file_handle *local_6d0;
  fdb_kvs_info local_6c8;
  timeval local_698;
  fdb_kvs_config local_688;
  fdb_file_info local_670;
  char local_628 [256];
  char local_528 [511];
  undefined1 local_329;
  fdb_config local_128;
  
  pcStack_6e0 = (code *)0x10d11a;
  gettimeofday(&local_698,(__timezone_ptr_t)0x0);
  pcStack_6e0 = (code *)0x10d11f;
  memleak_start();
  pcStack_6e0 = (code *)0x10d12c;
  fdb_get_default_kvs_config();
  pcStack_6e0 = (code *)0x10d13c;
  fdb_get_default_config();
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0x41;
  local_128.num_keeping_headers = 1;
  pcStack_6e0 = (code *)0x10d163;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_6e0 = (code *)0x10d17a;
  fdb_open(&local_6d0,"./staleblktest1",&local_128);
  pcStack_6e0 = (code *)0x10d188;
  fdb_kvs_open_default(local_6d0,&local_6d8,&local_688);
  pcVar9 = "%dkey";
  pcVar10 = local_628;
  pcVar11 = local_528;
  pcVar17 = (char *)0x0;
  do {
    pcStack_6e0 = (code *)0x10d1b0;
    sprintf(pcVar10,"%dkey",pcVar17);
    pcStack_6e0 = (code *)0x10d1c2;
    memset(pcVar11,0x62,0x1ff);
    pfVar15 = local_6d8;
    local_329 = 0;
    pcStack_6e0 = (code *)0x10d1d6;
    sVar4 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d1e1;
    sVar5 = strlen(pcVar11);
    pcStack_6e0 = (code *)0x10d1f5;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar4,pcVar11,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010d445:
      pcStack_6e0 = (code *)0x10d44c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d44c;
    }
    pcStack_6e0 = (code *)0x10d20c;
    fVar1 = fdb_commit(local_6d0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_6e0 = (code *)0x10d445;
      rollback_with_num_keeping_headers();
      goto LAB_0010d445;
    }
    uVar12 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar12;
  } while (uVar12 != 10);
  pcVar11 = (char *)0x0;
  pcVar17 = local_628;
  pcVar10 = local_528;
  pcVar9 = (char *)0x0;
  do {
    pfVar15 = local_6d8;
    builtin_strncpy(local_628,"0key",5);
    builtin_strncpy(local_528,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_6e0 = (code *)0x10d29e;
    sVar4 = strlen(pcVar17);
    pcStack_6e0 = (code *)0x10d2a9;
    sVar5 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d2bd;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d453;
    pcStack_6e0 = (code *)0x10d2d4;
    fVar1 = fdb_get_file_info(local_6d0,&local_670);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d44c;
    uVar12 = (int)pcVar9 + 1;
    pcVar9 = (char *)(ulong)uVar12;
  } while (local_670.file_size < 0x1000000);
  pcStack_6e0 = (code *)0x10d2f9;
  sVar2 = sb_check_block_reusing(local_6d8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010d461;
  pcStack_6e0 = (code *)0x10d311;
  fVar1 = fdb_commit(local_6d0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d466;
  pcVar10 = local_628;
  pcVar11 = local_528;
  pcVar17 = (char *)0x0;
  do {
    pcStack_6e0 = (code *)0x10d33e;
    sprintf(pcVar10,"%dkey",pcVar17);
    pcStack_6e0 = (code *)0x10d350;
    memset(pcVar11,100,0x1ff);
    pfVar15 = local_6d8;
    local_329 = 0;
    pcStack_6e0 = (code *)0x10d364;
    sVar4 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d36f;
    sVar5 = strlen(pcVar11);
    pcStack_6e0 = (code *)0x10d383;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar4,pcVar11,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d45a;
    uVar13 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar13;
  } while (uVar12 != uVar13);
  pcStack_6e0 = (code *)0x10d39e;
  fVar1 = fdb_rollback(&local_6d8,10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d46d;
  pcStack_6e0 = (code *)0x10d3b4;
  fVar1 = fdb_get_kvs_info(local_6d8,&local_6c8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d474;
  if (local_6c8.doc_count != 10) {
    pcStack_6e0 = (code *)0x10d3ce;
    rollback_with_num_keeping_headers();
  }
  pcStack_6e0 = (code *)0x10d3d7;
  fVar1 = fdb_kvs_close(local_6d8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d47b;
  pcStack_6e0 = (code *)0x10d3e9;
  fVar1 = fdb_close(local_6d0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_6e0 = (code *)0x10d3f6;
    fdb_shutdown();
    pcStack_6e0 = (code *)0x10d3fb;
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    pcStack_6e0 = (code *)0x10d42c;
    fprintf(_stderr,pcVar17,"rollback with num keeping headers");
    return;
  }
  goto LAB_0010d482;
LAB_0010d44c:
  pcStack_6e0 = (code *)0x10d453;
  rollback_with_num_keeping_headers();
LAB_0010d453:
  pcStack_6e0 = (code *)0x10d45a;
  rollback_with_num_keeping_headers();
LAB_0010d45a:
  pcStack_6e0 = (code *)0x10d461;
  rollback_with_num_keeping_headers();
LAB_0010d461:
  pcStack_6e0 = (code *)0x10d466;
  rollback_with_num_keeping_headers();
LAB_0010d466:
  pcStack_6e0 = (code *)0x10d46d;
  rollback_with_num_keeping_headers();
LAB_0010d46d:
  pcStack_6e0 = (code *)0x10d474;
  rollback_with_num_keeping_headers();
LAB_0010d474:
  pcStack_6e0 = (code *)0x10d47b;
  rollback_with_num_keeping_headers();
LAB_0010d47b:
  pcStack_6e0 = (code *)0x10d482;
  rollback_with_num_keeping_headers();
LAB_0010d482:
  pcStack_6e0 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_bc8 = (code *)0x10d4a6;
  fStack_900.bub_ctx.space_used = (uint64_t)pcVar9;
  sStack_6f8 = sVar4;
  pcStack_6f0 = pcVar10;
  pcStack_6e8 = pcVar11;
  pcStack_6e0 = (code *)pcVar17;
  gettimeofday(&tStack_b88,(__timezone_ptr_t)0x0);
  pcStack_bc8 = (code *)0x10d4ab;
  memleak_start();
  pcStack_bc8 = (code *)0x10d4b8;
  fdb_get_default_kvs_config();
  pcStack_bc8 = (code *)0x10d4c8;
  fdb_get_default_config();
  fStack_900.config.block_reusing_threshold._7_1_ = 0;
  fStack_900.max_seqnum = 0x41;
  fStack_900.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_900.dirty_updates = '\0';
  fStack_900._466_6_ = 0;
  pcStack_bc8 = (code *)0x10d4ef;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_bc8 = (code *)0x10d506;
  fdb_open(&pfStack_bb8,"./staleblktest1file.1",(fdb_config *)&fStack_900.config.encryption_key);
  pcStack_bc8 = (code *)0x10d51b;
  fdb_kvs_open(pfStack_bb8,&pfStack_bc0,"./staleblktest1",&fStack_ba0);
  pcVar10 = "%dkey";
  pfVar15 = &fStack_900;
  pfVar8 = (fdb_kvs_handle *)auStack_b00;
  pcVar17 = (char *)0x0;
  do {
    pcStack_bc8 = (code *)0x10d543;
    sprintf((char *)pfVar15,"%dkey",pcVar17);
    pcStack_bc8 = (code *)0x10d555;
    memset(pfVar8,0x62,0x1ff);
    pfVar7 = pfStack_bc0;
    auStack_b00[0x1ff] = 0;
    pcStack_bc8 = (code *)0x10d569;
    pfVar6 = (fdb_kvs_handle *)strlen((char *)pfVar15);
    pcStack_bc8 = (code *)0x10d574;
    sVar5 = strlen((char *)pfVar8);
    pcStack_bc8 = (code *)0x10d588;
    fVar1 = fdb_set_kv(pfVar7,pfVar15,(size_t)pfVar6,pfVar8,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010d9e8:
      pcStack_bc8 = (code *)0x10d9ef;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9ef;
    }
    pcStack_bc8 = (code *)0x10d59f;
    fVar1 = fdb_commit(pfStack_bb8,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_bc8 = (code *)0x10d9e8;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9e8;
    }
    uVar12 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pfVar8 = (fdb_kvs_handle *)0x0;
  pcVar10 = (char *)&fStack_900;
  pcVar17 = auStack_b00;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfVar7 = pfStack_bc0;
    fStack_900.kvs_config._4_1_ = 0;
    fStack_900.kvs_config.create_if_missing = true;
    fStack_900.kvs_config._1_3_ = 0x79656b;
    auStack_b00._0_8_ = 0x6363636363636363;
    auStack_b00._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_b00._16_8_ = (void *)0x6363636363636363;
    auStack_b00._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_b00._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_b00._40_7_ = 0x63636363636363;
    auStack_b00[0x2f] = 99;
    auStack_b00._48_7_ = 0x63636363636363;
    auStack_b00[0x37] = 99;
    auStack_b00._56_7_ = 0x63636363636363;
    auStack_b00[0x3f] = 99;
    auStack_b00._64_8_ = (btree *)0x6363636363636363;
    auStack_b00._72_8_ = (filemgr *)0x6363636363636363;
    auStack_b00._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_b00._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_b00._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_b00._104_7_ = 0x63636363636363;
    auStack_b00[0x6f] = 99;
    auStack_b00._112_7_ = 0x63636363636363;
    auStack_b00._119_8_ = 0x6363636363636363;
    auStack_b00[0x7f] = 0;
    pcStack_bc8 = (code *)0x10d632;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar10);
    pcStack_bc8 = (code *)0x10d63d;
    sVar5 = strlen(pcVar17);
    pcStack_bc8 = (code *)0x10d651;
    fVar1 = fdb_set_kv(pfVar7,pcVar10,(size_t)pfVar6,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d9f6;
    pcStack_bc8 = (code *)0x10d668;
    fVar1 = fdb_get_file_info(pfStack_bb8,&fStack_b78);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d9ef;
    pfVar15 = (fdb_kvs_handle *)(ulong)((int)pfVar15 + 1);
  } while (fStack_b78.file_size < 0x1000000);
  pcStack_bc8 = (code *)0x10d68b;
  sVar2 = sb_check_block_reusing(pfStack_bc0);
  if (sVar2 == SBD_RECLAIM) {
    pcStack_bc8 = (code *)0x10d6a3;
    fVar1 = fdb_commit(pfStack_bb8,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da25;
    pcStack_bc8 = (code *)0x10d6bc;
    fVar1 = fdb_get_kvs_info(pfStack_bc0,&fStack_b30);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da2c;
    pfStack_bb0 = (fdb_kvs_handle *)fStack_b30.last_seqnum;
    pfVar8 = &fStack_900;
    pfVar7 = (fdb_kvs_handle *)auStack_b00;
    pcVar17 = (char *)0x0;
    do {
      pcStack_bc8 = (code *)0x10d6f6;
      sprintf((char *)pfVar8,"%dkey",pcVar17);
      pfVar6 = pfStack_bc0;
      auStack_b00._0_8_ = 0x6464646464646464;
      auStack_b00._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_b00._16_8_ = (void *)0x6464646464646464;
      auStack_b00._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_b00._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_b00._40_7_ = 0x64646464646464;
      auStack_b00[0x2f] = 100;
      auStack_b00._48_7_ = 0x64646464646464;
      auStack_b00[0x37] = 100;
      auStack_b00._56_7_ = 0x64646464646464;
      auStack_b00[0x3f] = 0;
      pcStack_bc8 = (code *)0x10d731;
      pcVar10 = (char *)strlen((char *)pfVar8);
      pcStack_bc8 = (code *)0x10d73c;
      sVar5 = strlen((char *)pfVar7);
      pcStack_bc8 = (code *)0x10d750;
      fVar1 = fdb_set_kv(pfVar6,pfVar8,(size_t)pcVar10,pfVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da04;
      pcStack_bc8 = (code *)0x10d767;
      fVar1 = fdb_commit(pfStack_bb8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d9fd;
      uVar12 = (int)pcVar17 + 1;
      pcVar17 = (char *)(ulong)uVar12;
    } while (uVar12 != 10);
    pcStack_bc8 = (code *)0x10d783;
    fVar1 = fdb_kvs_close(pfStack_bc0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da33;
    pcStack_bc8 = (code *)0x10d795;
    fVar1 = fdb_close(pfStack_bb8);
    pcVar10 = (char *)pfStack_bb0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da3a;
    pcStack_bc8 = (code *)0x10d7a7;
    fdb_shutdown();
    pcStack_bc8 = (code *)0x10d7c0;
    fVar1 = fdb_open(&pfStack_bb8,"./staleblktest1file.1",
                     (fdb_config *)&fStack_900.config.encryption_key);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da41;
    pcStack_bc8 = (code *)0x10d7e1;
    fdb_kvs_open(pfStack_bb8,&pfStack_bc0,"./staleblktest1",&fStack_ba0);
    pcStack_bc8 = (code *)0x10d7f0;
    fVar1 = fdb_get_file_info(pfStack_bb8,&fStack_b78);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da48;
    pcStack_bc8 = (code *)0x10d818;
    iVar3 = _disk_dump("./staleblktest1file.1",fStack_b78.file_size,
                       (ulong)(((uint)fStack_900.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_900.config.encryption_key.bytes._0_4_ * 2));
    if (iVar3 < 0) goto LAB_0010da4f;
    pcStack_bc8 = (code *)0x10d831;
    fVar1 = fdb_snapshot_open(pfStack_bc0,&pfStack_ba8,(fdb_seqnum_t)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da54;
    pcStack_bc8 = (code *)0x10d844;
    fVar1 = fdb_rollback(&pfStack_bc0,(fdb_seqnum_t)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da5b;
    pcStack_bc8 = (code *)0x10d85d;
    fVar1 = fdb_compact(pfStack_bb8,"./staleblktest1file.3");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da62;
    pcVar10 = "%dkey";
    pfVar7 = &fStack_900;
    pcVar17 = (char *)0x0;
    do {
      pcStack_bc8 = (code *)0x10d885;
      sprintf((char *)pfVar7,"%dkey",pcVar17);
      pfVar8 = pfStack_bc0;
      pcStack_bc8 = (code *)0x10d891;
      sVar5 = strlen((char *)pfVar7);
      pcStack_bc8 = (code *)0x10d89f;
      fVar1 = fdb_del_kv(pfVar8,pfVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da12;
      pcStack_bc8 = (code *)0x10d8b6;
      fVar1 = fdb_commit(pfStack_bb8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da0b;
      uVar12 = (int)pcVar17 + 1;
      pcVar17 = (char *)(ulong)uVar12;
    } while (uVar12 != 0xb);
    pcStack_bc8 = (code *)0x10d8ce;
    sVar2 = sb_check_block_reusing(pfStack_bc0);
    if (sVar2 != SBD_NONE) goto LAB_0010da69;
    pcVar17 = (char *)0x0;
    pcVar10 = auStack_b00;
    pfVar6 = &fStack_900;
    do {
      fStack_900.kvs_config._4_1_ = 0;
      fStack_900.kvs_config.create_if_missing = true;
      fStack_900.kvs_config._1_3_ = 0x79656b;
      pcStack_bc8 = (code *)0x10d90d;
      memset(pcVar10,0x65,0x1ff);
      pfVar8 = pfStack_bc0;
      auStack_b00[0x1ff] = 0;
      pcStack_bc8 = (code *)0x10d921;
      pfVar7 = (fdb_kvs_handle *)strlen((char *)pfVar6);
      pcStack_bc8 = (code *)0x10d92c;
      sVar5 = strlen(pcVar10);
      pcStack_bc8 = (code *)0x10d940;
      fVar1 = fdb_set_kv(pfVar8,pfVar6,(size_t)pfVar7,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da19;
      uVar12 = (int)pfVar15 - 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar12 != 0);
    pcStack_bc8 = (code *)0x10d956;
    sVar2 = sb_check_block_reusing(pfStack_bc0);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010da6e;
    pcStack_bc8 = (code *)0x10d969;
    fVar1 = fdb_kvs_close(pfStack_ba8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da73;
    pcStack_bc8 = (code *)0x10d97a;
    fVar1 = fdb_kvs_close(pfStack_bc0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da7a;
    pcStack_bc8 = (code *)0x10d98c;
    fVar1 = fdb_close(pfStack_bb8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_bc8 = (code *)0x10d999;
      fdb_shutdown();
      pcStack_bc8 = (code *)0x10d99e;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_bc8 = (code *)0x10d9cf;
      fprintf(_stderr,pcVar17,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da20:
    pcStack_bc8 = (code *)0x10da25;
    crash_and_recover_with_num_keeping_test();
LAB_0010da25:
    pcStack_bc8 = (code *)0x10da2c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da2c:
    pcStack_bc8 = (code *)0x10da33;
    crash_and_recover_with_num_keeping_test();
LAB_0010da33:
    pcStack_bc8 = (code *)0x10da3a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da3a:
    pcStack_bc8 = (code *)0x10da41;
    crash_and_recover_with_num_keeping_test();
LAB_0010da41:
    pcStack_bc8 = (code *)0x10da48;
    crash_and_recover_with_num_keeping_test();
LAB_0010da48:
    pcStack_bc8 = (code *)0x10da4f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4f:
    pcStack_bc8 = (code *)0x10da54;
    crash_and_recover_with_num_keeping_test();
LAB_0010da54:
    pcStack_bc8 = (code *)0x10da5b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5b:
    pcStack_bc8 = (code *)0x10da62;
    crash_and_recover_with_num_keeping_test();
LAB_0010da62:
    pcStack_bc8 = (code *)0x10da69;
    crash_and_recover_with_num_keeping_test();
LAB_0010da69:
    pcStack_bc8 = (code *)0x10da6e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6e:
    pcStack_bc8 = (code *)0x10da73;
    crash_and_recover_with_num_keeping_test();
LAB_0010da73:
    pcStack_bc8 = (code *)0x10da7a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7a:
    pcStack_bc8 = (code *)0x10da81;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_bc8 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_1070 = (fdb_kvs_handle *)0x10daa5;
  pfStack_bf0 = (fdb_kvs_handle *)pcVar10;
  pfStack_be8 = pfVar7;
  pfStack_be0 = pfVar6;
  pfStack_bd8 = pfVar15;
  pfStack_bd0 = pfVar8;
  pcStack_bc8 = (code *)pcVar17;
  gettimeofday(&tStack_1058,(__timezone_ptr_t)0x0);
  pfStack_1070 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_1070 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_1070 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  uStack_cb9 = 0;
  pfStack_c30 = (fdb_kvs_handle *)0x41;
  uStack_c18 = 10;
  pfStack_1070 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1070 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&pfStack_1060,"./staleblktest1",(fdb_config *)(auStack_e30 + 0x148));
  pfStack_1070 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(pfStack_1060,&pfStack_1068,(fdb_kvs_config *)(auStack_1048 + 0x200));
  pcVar11 = "%dkey";
  pcVar10 = auStack_e30 + 0x48;
  pcVar17 = auStack_1048;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1070 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar10,"%dkey",pfVar15);
    pfStack_1070 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar17,0x62,0x1ff);
    pfVar8 = pfStack_1068;
    auStack_1048[0x1ff] = 0;
    pfStack_1070 = (fdb_kvs_handle *)0x10db61;
    pfVar7 = (fdb_kvs_handle *)strlen(pcVar10);
    pfStack_1070 = (fdb_kvs_handle *)0x10db6c;
    sVar5 = strlen(pcVar17);
    pfStack_1070 = (fdb_kvs_handle *)0x10db80;
    fVar1 = fdb_set_kv(pfVar8,pcVar10,(size_t)pfVar7,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_1070 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_1070 = (fdb_kvs_handle *)0x10db97;
    fVar1 = fdb_commit(pfStack_1060,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_1070 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar17 = auStack_e30 + 0x48;
  pfVar8 = (fdb_kvs_handle *)auStack_1048;
  pfVar7 = (fdb_kvs_handle *)auStack_e30;
  pcVar11 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar6 = (fdb_kvs_handle *)pcVar11;
    pfStack_1070 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar17,"%dkey",pfVar6);
    pfVar15 = pfStack_1068;
    auStack_1048._0_8_ = 0x6363636363636363;
    auStack_1048._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1048._16_8_ = (void *)0x6363636363636363;
    auStack_1048._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1048._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1048._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1048._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1048._56_8_ = (btree *)0x6363636363636363;
    auStack_1048._64_8_ = (btree *)0x6363636363636363;
    auStack_1048._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1048._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1048._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1048._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1048._104_7_ = 0x63636363636363;
    auStack_1048[0x6f] = 99;
    auStack_1048._112_7_ = 0x63636363636363;
    auStack_1048._119_8_ = 0x6363636363636363;
    auStack_1048[0x7f] = 0;
    pfStack_1070 = (fdb_kvs_handle *)0x10dc19;
    pcVar10 = (char *)strlen(pcVar17);
    pfStack_1070 = (fdb_kvs_handle *)0x10dc24;
    sVar5 = strlen((char *)pfVar8);
    pfStack_1070 = (fdb_kvs_handle *)0x10dc38;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,(size_t)pcVar10,pfVar8,sVar5);
    pcVar11 = (char *)pfVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_1070 = (fdb_kvs_handle *)0x10dc4d;
    fVar1 = fdb_get_file_info(pfStack_1060,(fdb_file_info *)pfVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar12 = (uint)pfVar6 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while ((ulong)auStack_e30._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_1070 = (fdb_kvs_handle *)0x10dc72;
  sVar2 = sb_check_block_reusing(pfStack_1068);
  if (sVar2 == SBD_NONE) {
    pfStack_1070 = (fdb_kvs_handle *)0x10dc89;
    fVar1 = fdb_commit(pfStack_1060,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
    pcVar10 = "%dkey";
    pcVar17 = auStack_e30 + 0x48;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1070 = (fdb_kvs_handle *)0x10dcb5;
      sprintf(pcVar17,"%dkey",pfVar15);
      pfVar8 = pfStack_1068;
      pfStack_1070 = (fdb_kvs_handle *)0x10dcc1;
      sVar5 = strlen(pcVar17);
      pfStack_1070 = (fdb_kvs_handle *)0x10dccf;
      fVar1 = fdb_del_kv(pfVar8,pcVar17,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
      uVar13 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pfStack_1070 = (fdb_kvs_handle *)0x10dce6;
    sVar2 = sb_check_block_reusing(pfStack_1068);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de48;
    if (2 < (uint)pfVar6) {
      pcVar11 = (char *)(ulong)(uVar12 >> 2);
      pcVar17 = auStack_e30 + 0x48;
      pfVar8 = (fdb_kvs_handle *)auStack_1048;
      pfVar15 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_1070 = (fdb_kvs_handle *)0x10dd1e;
        sprintf(pcVar17,"%dkey",pfVar15);
        pfVar6 = pfStack_1068;
        auStack_1048._0_8_ = 0x6464646464646464;
        auStack_1048._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1048._16_8_ = (void *)0x6464646464646464;
        auStack_1048._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1048._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1048._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1048._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1048._56_8_ = (btree *)0x6464646464646464;
        auStack_1048._64_8_ = (btree *)0x6464646464646464;
        auStack_1048._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1048._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1048._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1048._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1048._104_7_ = 0x64646464646464;
        auStack_1048[0x6f] = 100;
        auStack_1048._112_7_ = 0x64646464646464;
        auStack_1048._119_8_ = 0x6464646464646464;
        auStack_1048[0x7f] = 0;
        pfStack_1070 = (fdb_kvs_handle *)0x10dd67;
        pcVar10 = (char *)strlen(pcVar17);
        pfStack_1070 = (fdb_kvs_handle *)0x10dd72;
        sVar5 = strlen((char *)pfVar8);
        pfStack_1070 = (fdb_kvs_handle *)0x10dd86;
        fVar1 = fdb_set_kv(pfVar6,pcVar17,(size_t)pcVar10,pfVar8,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
        uVar13 = (int)pfVar15 + 2;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
      } while (uVar13 < uVar12 >> 2);
    }
    pcVar17 = auStack_e30 + 0x48;
    pfStack_1070 = (fdb_kvs_handle *)0x10dda2;
    sVar2 = sb_check_block_reusing(pfStack_1068);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de4d;
    pfStack_1070 = (fdb_kvs_handle *)0x10ddb5;
    fVar1 = fdb_close(pfStack_1060);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
    pfStack_1070 = (fdb_kvs_handle *)0x10ddc2;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1070 = (fdb_kvs_handle *)0x10ddcf;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_1070 = (fdb_kvs_handle *)0x10de00;
      fprintf(_stderr,pcVar17,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de3c:
    pfStack_1070 = (fdb_kvs_handle *)0x10de41;
    reuse_on_delete_test();
LAB_0010de41:
    pfVar6 = pfVar7;
    pfStack_1070 = (fdb_kvs_handle *)0x10de48;
    reuse_on_delete_test();
LAB_0010de48:
    pfStack_1070 = (fdb_kvs_handle *)0x10de4d;
    reuse_on_delete_test();
LAB_0010de4d:
    pfStack_1070 = (fdb_kvs_handle *)0x10de52;
    reuse_on_delete_test();
LAB_0010de52:
    pfStack_1070 = (fdb_kvs_handle *)0x10de59;
    reuse_on_delete_test();
  }
  pfStack_1070 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1558 = (fdb_kvs_handle *)0x10de7d;
  fStack_1290.bub_ctx.space_used = (uint64_t)pcVar11;
  fStack_1290.bub_ctx.handle = pfVar8;
  pfStack_1088 = pfVar6;
  pcStack_1080 = pcVar10;
  pcStack_1078 = pcVar17;
  pfStack_1070 = pfVar15;
  gettimeofday(&tStack_1500,(__timezone_ptr_t)0x0);
  pfStack_1558 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_1558 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_1558 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_1290.config.block_reusing_threshold._7_1_ = 0;
  fStack_1290.max_seqnum = 0x23;
  fStack_1290.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1290.dirty_updates = '\0';
  fStack_1290._466_6_ = 0;
  pfStack_1558 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1558 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_1540,"./staleblktest1",(fdb_config *)&fStack_1290.config.encryption_key);
  pfStack_1558 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_1540,&pfStack_1548,&fStack_14f0);
  pcVar11 = "%dkey";
  pcVar17 = (char *)&fStack_1290;
  pcVar10 = auStack_14d8 + 0x48;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1558 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar17,"%dkey",pfVar15);
    pfStack_1558 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar10,0x61,0x1ff);
    pfVar7 = pfStack_1548;
    uStack_1291 = 0;
    pfStack_1558 = (fdb_kvs_handle *)0x10df3c;
    pfVar8 = (fdb_kvs_handle *)strlen(pcVar17);
    pfStack_1558 = (fdb_kvs_handle *)0x10df47;
    sVar5 = strlen(pcVar10);
    pfStack_1558 = (fdb_kvs_handle *)0x10df5b;
    fVar1 = fdb_set_kv(pfVar7,pcVar17,(size_t)pfVar8,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_1558 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_1558 = (fdb_kvs_handle *)0x10df72;
    fVar1 = fdb_commit(pfStack_1540,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar10 = (char *)&fStack_1290;
  pfVar7 = (fdb_kvs_handle *)(auStack_14d8 + 0x48);
  pfVar8 = (fdb_kvs_handle *)auStack_14d8;
  pcVar11 = (char *)0x0;
  do {
    uVar12 = (uint)pcVar11;
    pfStack_1558 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar10,"%dkey",pcVar11);
    pfVar15 = pfStack_1548;
    auStack_14d8._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1488 = (docio_handle *)0x6262626262626262;
    pbStack_1480 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1478 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1470 = (filemgr_ops *)0x6262626262626262;
    fStack_1468.chunksize = 0x6262;
    fStack_1468._2_2_ = 0x6262;
    fStack_1468.blocksize = 0x62626262;
    fStack_1468.buffercache_size = 0x6262626262626262;
    fStack_1468.wal_threshold = 0x6262626262626262;
    fStack_1468.wal_flush_before_commit = true;
    fStack_1468.auto_commit = true;
    fStack_1468._26_2_ = 0x6262;
    fStack_1468.purging_interval = 0x62626262;
    fStack_1468.seqtree_opt = 'b';
    fStack_1468.durability_opt = 'b';
    fStack_1468._34_2_ = 0x6262;
    fStack_1468.flags = 0x62626262;
    fStack_1468.compaction_buf_maxsize = 0x62626262;
    fStack_1468.cleanup_cache_onclose = true;
    fStack_1468.compress_document_body = true;
    fStack_1468.compaction_mode = 'b';
    fStack_1468.compaction_threshold = 'b';
    fStack_1468.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1468.compactor_sleep_duration = 0x6262626262626262;
    fStack_1468.multi_kv_instances = true;
    fStack_1468._65_6_ = 0x626262626262;
    fStack_1468._71_1_ = 0x62;
    fStack_1468.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1468._79_8_ = 0x6262626262626262;
    fStack_1468._87_1_ = 0;
    pfStack_1558 = (fdb_kvs_handle *)0x10e007;
    pcVar17 = (char *)strlen(pcVar10);
    pfStack_1558 = (fdb_kvs_handle *)0x10e012;
    sVar5 = strlen((char *)pfVar7);
    pfStack_1558 = (fdb_kvs_handle *)0x10e026;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,(size_t)pcVar17,pfVar7,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_1558 = (fdb_kvs_handle *)0x10e03b;
    fVar1 = fdb_get_file_info(pfStack_1540,(fdb_file_info *)pfVar8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar13 = uVar12 + 1;
    pcVar11 = (char *)(ulong)uVar13;
  } while ((ulong)auStack_14d8._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1534 = uVar12;
  if (2 < uVar12) {
    uVar12 = (uVar13 >> 2) + (uint)(uVar13 >> 2 == 0);
    pfVar8 = (fdb_kvs_handle *)(ulong)uVar12;
    pcVar17 = "%dkey";
    pcVar10 = (char *)&fStack_1290;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1558 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar10,"%dkey",pfVar15);
      pfVar7 = pfStack_1548;
      pfStack_1558 = (fdb_kvs_handle *)0x10e09f;
      sVar5 = strlen(pcVar10);
      pfStack_1558 = (fdb_kvs_handle *)0x10e0ad;
      fVar1 = fdb_del_kv(pfVar7,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar12 != uVar14);
  }
  pcVar10 = (char *)&fStack_1290;
  pfStack_1558 = (fdb_kvs_handle *)0x10e0c6;
  sVar2 = sb_check_block_reusing(pfStack_1548);
  if (sVar2 == SBD_NONE) {
    pcVar10 = (char *)(pfStack_1548->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1558 = (fdb_kvs_handle *)0x10e0ec;
    fVar1 = fdb_compact(pfStack_1540,"staleblktest_compact");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_1558 = (fdb_kvs_handle *)0x10e103;
    fVar1 = fdb_get_kvs_info(pfStack_1548,&fStack_1530);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_1530.doc_count == 0) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar17 = (char *)(ulong)(uVar13 >> 2);
    if (pcVar10 <=
        (fdb_kvs_handle *)(pfStack_1548->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar12 = uVar13 >> 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
    if (uVar13 >> 2 < uVar12) {
      pcVar10 = "%dkey";
      pfVar7 = &fStack_1290;
      do {
        pfStack_1558 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar7,"%dkey",pcVar17);
        pfVar8 = pfStack_1548;
        pfStack_1558 = (fdb_kvs_handle *)0x10e178;
        sVar5 = strlen((char *)pfVar7);
        pfStack_1558 = (fdb_kvs_handle *)0x10e186;
        fVar1 = fdb_del_kv(pfVar8,pfVar7,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar14 = (int)pcVar17 + 1;
        pcVar17 = (char *)(ulong)uVar14;
      } while (uVar14 < uVar12);
    }
    pfStack_1558 = (fdb_kvs_handle *)0x10e1a0;
    sVar2 = sb_check_block_reusing(pfStack_1548);
    if (sVar2 != SBD_NONE) goto LAB_0010e307;
    if (uVar12 <= uStack_1534) {
      pcVar17 = "%dkey";
      pcVar10 = (char *)&fStack_1290;
      do {
        pfStack_1558 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar10,"%dkey",pfVar15);
        pfVar7 = pfStack_1548;
        pfStack_1558 = (fdb_kvs_handle *)0x10e1d9;
        sVar5 = strlen(pcVar10);
        pfStack_1558 = (fdb_kvs_handle *)0x10e1e7;
        fVar1 = fdb_del_kv(pfVar7,pcVar10,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar12 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar13 != uVar12);
    }
    pcVar11 = (char *)0xb;
    do {
      pfStack_1558 = (fdb_kvs_handle *)0x10e209;
      fVar1 = fdb_commit(pfStack_1540,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (uVar12 != 0);
    pfStack_1558 = (fdb_kvs_handle *)0x10e224;
    fVar1 = fdb_get_kvs_info(pfStack_1548,&fStack_1530);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_1558 = (fdb_kvs_handle *)0x10e236;
    sVar2 = sb_check_block_reusing(pfStack_1548);
    if (sVar2 == SBD_NONE) goto LAB_0010e313;
    pfStack_1558 = (fdb_kvs_handle *)0x10e24d;
    fVar1 = fdb_commit(pfStack_1540,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_1558 = (fdb_kvs_handle *)0x10e25f;
    fVar1 = fdb_close(pfStack_1540);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_1558 = (fdb_kvs_handle *)0x10e26c;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_1558 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar17,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_1558 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_1558 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_1558 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_1558 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_1558 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_1558 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_1558 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_1558 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_1558 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_1a20 = (code *)0x10e34a;
  pcStack_1580 = pcVar11;
  pfStack_1578 = pfVar7;
  pfStack_1570 = pfVar8;
  pfStack_1568 = (fdb_kvs_handle *)pcVar17;
  pfStack_1560 = (fdb_kvs_handle *)pcVar10;
  pfStack_1558 = pfVar15;
  gettimeofday(&tStack_19e8,(__timezone_ptr_t)0x0);
  pcStackY_1a20 = (code *)0x10e34f;
  memleak_start();
  pfStack_19f8 = (fdb_doc *)0x0;
  pcStackY_1a20 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_1a20 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_1678.compaction_threshold = '\0';
  fStack_1678.block_reusing_threshold = 0x23;
  fStack_1678.num_keeping_headers = 10;
  pcStackY_1a20 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_1a20 = (code *)0x10e3b6;
  fdb_open(&pfStack_1a08,"./staleblktest1",&fStack_1678);
  pcStackY_1a20 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_1a08,&pfStack_1a10,"db",&fStack_17d8);
  pcStackY_1a20 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_1a08,&pfStack_19f0,"db2",&fStack_17d8);
  pcVar17 = acStack_1778;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar10 = acStack_19d8;
  pcVar11 = (char *)0x0;
  do {
    pcStackY_1a20 = (code *)0x10e410;
    sprintf(pcVar17,"%dkey",pcVar11);
    pfVar15 = pfStack_1a10;
    builtin_strncpy(acStack_19d8,"aaaaaaaaaaa",0xc);
    pcStackY_1a20 = (code *)0x10e42f;
    sVar4 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e43a;
    sVar5 = strlen(pcVar10);
    pcStackY_1a20 = (code *)0x10e44e;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    pfVar15 = pfStack_19f0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_1a20 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_1a20 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_1a20 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_1a20 = (code *)0x10e463;
    sVar4 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e46e;
    sVar5 = strlen(pcVar10);
    pcStackY_1a20 = (code *)0x10e482;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_1a20 = (code *)0x10e499;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar12 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while (uVar12 != 10);
  pcVar10 = (char *)0x0;
  pcVar11 = acStack_1778;
  pcVar17 = acStack_19d8;
  doc = (fdb_doc **)0x0;
  do {
    pfVar15 = pfStack_1a10;
    builtin_strncpy(acStack_1778,"0key",5);
    builtin_strncpy(acStack_19d8,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_1a20 = (code *)0x10e521;
    sVar4 = strlen(pcVar11);
    pcStackY_1a20 = (code *)0x10e52c;
    sVar5 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e540;
    fVar1 = fdb_set_kv(pfVar15,pcVar11,sVar4,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_1a20 = (code *)0x10e55a;
    fVar1 = fdb_get_file_info(pfStack_1a08,&fStack_17c0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar12 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar12;
  } while (fStack_17c0.file_size < 0x1000000);
  pcStackY_1a20 = (code *)0x10e580;
  sVar2 = sb_check_block_reusing(pfStack_1a10);
  if (sVar2 == SBD_RECLAIM) {
    pcStackY_1a20 = (code *)0x10e598;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar17 = acStack_1778;
    pcVar10 = acStack_19d8;
    pcVar11 = (char *)0x0;
    do {
      pcStackY_1a20 = (code *)0x10e5c2;
      sprintf(pcVar17,"key%d",pcVar11);
      pfVar15 = pfStack_1a10;
      builtin_strncpy(acStack_19d8,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_1a20 = (code *)0x10e612;
      sVar4 = strlen(pcVar17);
      pcStackY_1a20 = (code *)0x10e61d;
      sVar5 = strlen(pcVar10);
      pcStackY_1a20 = (code *)0x10e631;
      fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar13 = (int)pcVar11 + 1;
      pcVar11 = (char *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pcStackY_1a20 = (code *)0x10e652;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_1a20 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_19f0,&pfStack_1a00,(void *)0x0,0,(void *)0x0,0,0);
    pcVar11 = (char *)0xa;
    doc = &pfStack_19f8;
    do {
      pcStackY_1a20 = (code *)0x10e691;
      fVar1 = fdb_iterator_get(pfStack_1a00,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_1a20 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_19f8);
      pfStack_19f8 = (fdb_doc *)0x0;
      pcStackY_1a20 = (code *)0x10e6b6;
      fVar1 = fdb_iterator_next(pfStack_1a00);
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar12 != 0) goto LAB_0010e794;
    pcStackY_1a20 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_1a00);
    pcStackY_1a20 = (code *)0x10e6d9;
    fVar1 = fdb_kvs_close(pfStack_1a10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_1a20 = (code *)0x10e6eb;
    fVar1 = fdb_kvs_close(pfStack_19f0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_1a20 = (code *)0x10e6fd;
      fVar1 = fdb_close(pfStack_1a08);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStackY_1a20 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_1a20 = (code *)0x10e70f;
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pcStackY_1a20 = (code *)0x10e740;
        fprintf(_stderr,pcVar17,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_1a20 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_1a20 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_1a20 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_1a20 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_1a20 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_1a20 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_1a20 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_1a48 = doc;
  sStackY_1a38 = sVar4;
  pcStackY_1a30 = pcVar17;
  pcStackY_1a28 = pcVar10;
  pcStackY_1a20 = (code *)pcVar11;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_1d48.block_reusing_threshold = 0x41;
  fStackY_1d48.num_keeping_headers = 5;
  fdb_open(&pfStackY_1e70,"./staleblktest1",&fStackY_1d48);
  fdb_kvs_open(pfStackY_1e70,&pfStackY_1e78,"db",&fStackY_1e68);
  iVar3 = 0;
  uVar16 = 0;
  do {
    sprintf(acStackY_1e50,"key%d",uVar16);
    sprintf(acStackY_1c50,"seqno%d",uVar16);
    pfVar15 = pfStackY_1e78;
    sVar5 = strlen(acStackY_1e50);
    sVar4 = strlen(acStackY_1c50);
    fdb_set_kv(pfVar15,acStackY_1e50,sVar5,acStackY_1c50,sVar4);
    if ((int)(uVar16 / 100) * 100 + iVar3 == 0) {
      fdb_commit(pfStackY_1e70,(int)(uVar16 / 500) * 500 + iVar3 == 0);
    }
    uVar16 = (ulong)((int)uVar16 + 1);
    iVar3 = iVar3 + -1;
  } while( true );
LAB_0010d9ef:
  pcStack_bc8 = (code *)0x10d9f6;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9f6:
  pcStack_bc8 = (code *)0x10d9fd;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9fd:
  pcStack_bc8 = (code *)0x10da04;
  crash_and_recover_with_num_keeping_test();
LAB_0010da04:
  pcStack_bc8 = (code *)0x10da0b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da0b:
  pcStack_bc8 = (code *)0x10da12;
  crash_and_recover_with_num_keeping_test();
LAB_0010da12:
  pcStack_bc8 = (code *)0x10da19;
  crash_and_recover_with_num_keeping_test();
LAB_0010da19:
  pcStack_bc8 = (code *)0x10da20;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da20;
LAB_0010de20:
  pfStack_1070 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  pfVar6 = pfVar7;
  pfStack_1070 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_1070 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_1070 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar7 = pfVar6;
  goto LAB_0010de3c;
LAB_0010e2ca:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_1a20 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_1a20 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_1a20 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_1a20 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void rollback_with_num_keeping_headers() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    char keybuf[256];
    char bodybuf[1024];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 1;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 10 headers
    for (i = 0; i < 10; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    n = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reclaim old header via 11th commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // load unique keys to reuse old blocks
    for (i = 0; i < n; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // do rollback to 10th headers
    status = fdb_rollback(&db, 10);
    TEST_STATUS(status);

    // expect only 10 docs
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    TEST_CHK(kvs_info.doc_count == 10);

    // cleanup
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback with num keeping headers");
}